

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<signed_char,_unsigned_long,_14>::Addition
               (char *lhs,unsigned_long *rhs,char *result)

{
  bool bVar1;
  int iVar2;
  int in_EDX;
  undefined8 *in_RSI;
  char *in_RDI;
  uint32_t tmp;
  undefined4 in_stack_ffffffffffffffd8;
  bool local_1;
  
  if ((((int)((ulong)*in_RSI >> 0x20) == 0) &&
      (iVar2 = (int)*in_RSI + (int)*in_RDI, *in_RDI <= iVar2)) &&
     (bVar1 = SafeCastHelper<signed_char,_int,_4>::Cast
                        (in_EDX,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffd8)), bVar1)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // rhs is std::uint64_t, lhs signed, 32-bit or less
        if( (std::uint32_t)( rhs >> 32 ) == 0 )
        {
            // Now it just happens to work out that the standard behavior does what we want
            // Adding explicit casts to show exactly what's happening here
            // Note - this is tweaked to keep optimizers from tossing out the code.
            std::uint32_t tmp = (std::uint32_t)rhs + (std::uint32_t)lhs;

            if( (std::int32_t)tmp >= lhs && SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::Cast( (std::int32_t)tmp, result ) )
                return true;
        }

        return false;
    }